

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenStruct
          (KotlinGenerator *this,StructDef *struct_def,CodeWriter *writer,IDLOptions *options)

{
  IdlNamer *pIVar1;
  bool bVar2;
  char *__s;
  allocator<char> local_113;
  allocator<char> local_112;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [32];
  string local_d0;
  _Any_data local_b0;
  code *local_a0;
  code *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if ((struct_def->super_Definition).generated == false) {
    GenerateComment(this,&(struct_def->super_Definition).doc_comment,writer,
                    (CommentConfig *)(anonymous_namespace)::comment_config);
    bVar2 = struct_def->fixed;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"struct_name",(allocator<char> *)&local_d0);
    pIVar1 = &this->namer_;
    (*(this->namer_).super_Namer._vptr_Namer[0xf])(local_f0,pIVar1,struct_def);
    CodeWriter::SetValue(writer,&local_110,(string *)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,"superclass",(allocator<char> *)&local_d0);
    __s = "Table";
    if (bVar2 != false) {
      __s = "Struct";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,__s,(allocator<char> *)local_b0._M_pod_data);
    CodeWriter::SetValue(writer,&local_110,(string *)local_f0);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"@Suppress(\"unused\")",(allocator<char> *)&local_110);
    CodeWriter::operator+=(writer,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"class {{struct_name}} : {{superclass}}() {\n",
               (allocator<char> *)&local_110);
    CodeWriter::operator+=(writer,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"__init",&local_112);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,"_i: Int, _bb: ByteBuffer",&local_113);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_111);
    local_b0._8_8_ = 0;
    local_98 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin.cpp:505:19)>
               ::_M_invoke;
    local_a0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin.cpp:505:19)>
               ::_M_manager;
    local_b0._M_unused._M_object = writer;
    GenerateFun(writer,&local_110,(string *)local_f0,&local_d0,(function<void_()> *)&local_b0,false)
    ;
    std::_Function_base::~_Function_base((_Function_base *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"__assign",&local_112);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f0,"_i: Int, _bb: ByteBuffer",&local_113);
    (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_d0,pIVar1,struct_def);
    local_b0._8_8_ = 0;
    local_98 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin.cpp:509:44)>
               ::_M_invoke;
    local_a0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin.cpp:509:44)>
               ::_M_manager;
    local_b0._M_unused._M_object = writer;
    GenerateFun(writer,&local_110,(string *)local_f0,&local_d0,(function<void_()> *)&local_b0,false)
    ;
    std::_Function_base::~_Function_base((_Function_base *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    GenerateStructGetters(this,struct_def,writer);
    local_f0._0_8_ = struct_def;
    local_f0._8_8_ = writer;
    local_f0._16_8_ = options;
    local_f0._24_8_ = this;
    std::function<void()>::
    function<flatbuffers::kotlin::KotlinGenerator::GenStruct(flatbuffers::StructDef&,flatbuffers::CodeWriter&,flatbuffers::IDLOptions)const::_lambda()_3_,void>
              ((function<void()> *)&local_110,(anon_class_32_4_a0854209 *)local_f0);
    GenerateCompanionObject(this,writer,(function<void_()> *)&local_110);
    std::_Function_base::~_Function_base((_Function_base *)&local_110);
    if (writer->cur_ident_lvl_ != 0) {
      writer->cur_ident_lvl_ = writer->cur_ident_lvl_ + -1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"}",(allocator<char> *)&local_110);
    CodeWriter::operator+=(writer,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  return;
}

Assistant:

void GenStruct(StructDef &struct_def, CodeWriter &writer,
                 IDLOptions options) const {
    if (struct_def.generated) return;

    GenerateComment(struct_def.doc_comment, writer, &comment_config);
    auto fixed = struct_def.fixed;

    writer.SetValue("struct_name", namer_.Type(struct_def));
    writer.SetValue("superclass", fixed ? "Struct" : "Table");

    writer += "@Suppress(\"unused\")";
    writer += "class {{struct_name}} : {{superclass}}() {\n";

    writer.IncrementIdentLevel();

    {
      // Generate the __init() method that sets the field in a pre-existing
      // accessor object. This is to allow object reuse.
      GenerateFun(writer, "__init", "_i: Int, _bb: ByteBuffer", "",
                  [&]() { writer += "__reset(_i, _bb)"; });

      // Generate assign method
      GenerateFun(writer, "__assign", "_i: Int, _bb: ByteBuffer",
                  namer_.Type(struct_def), [&]() {
                    writer += "__init(_i, _bb)";
                    writer += "return this";
                  });

      // Generate all getters
      GenerateStructGetters(struct_def, writer);

      // Generate Static Fields
      GenerateCompanionObject(writer, [&]() {
        if (!struct_def.fixed) {
          FieldDef *key_field = nullptr;

          // Generate version check method.
          // Force compile time error if not using the same version
          // runtime.
          GenerateFunOneLine(
              writer, "validateVersion", "", "",
              [&]() { writer += "Constants.FLATBUFFERS_24_3_25()"; },
              options.gen_jvmstatic);

          GenerateGetRootAsAccessors(namer_.Type(struct_def), writer, options);
          GenerateBufferHasIdentifier(struct_def, writer, options);
          GenerateTableCreator(struct_def, writer, options);

          GenerateStartStructMethod(struct_def, writer, options);

          // Static Add for fields
          auto fields = struct_def.fields.vec;
          int field_pos = -1;
          for (auto it = fields.begin(); it != fields.end(); ++it) {
            auto &field = **it;
            field_pos++;
            if (field.deprecated) continue;
            if (field.key) key_field = &field;
            GenerateAddField(NumToString(field_pos), field, writer, options);

            if (IsVector(field.value.type)) {
              auto vector_type = field.value.type.VectorType();
              if (!IsStruct(vector_type)) {
                GenerateCreateVectorField(field, writer, options);
              }
              GenerateStartVectorField(field, writer, options);
            }
          }

          GenerateEndStructMethod(struct_def, writer, options);
          auto file_identifier = parser_.file_identifier_;
          if (parser_.root_struct_def_ == &struct_def) {
            GenerateFinishStructBuffer(struct_def, file_identifier, writer,
                                       options);
            GenerateFinishSizePrefixed(struct_def, file_identifier, writer,
                                       options);
          }

          if (struct_def.has_key) {
            GenerateLookupByKey(key_field, struct_def, writer, options);
          }
        } else {
          GenerateStaticConstructor(struct_def, writer, options);
        }
      });
    }

    // class closing
    writer.DecrementIdentLevel();
    writer += "}";
  }